

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

void test_key_exchanges(void)

{
  char *_name_7;
  char *_name_6;
  char *_name_5;
  char *_name_4;
  char *_name_3;
  char *_name_2;
  char *_name_1;
  char *_name;
  
  enter_subtest("secp256r1-self");
  test_key_exchange(&ptls_openssl_secp256r1,&ptls_openssl_secp256r1);
  exit_subtest("secp256r1-self");
  enter_subtest("secp256r1-to-minicrypto");
  test_key_exchange(&ptls_openssl_secp256r1,&ptls_minicrypto_secp256r1);
  exit_subtest("secp256r1-to-minicrypto");
  enter_subtest("secp256r1-from-minicrypto");
  test_key_exchange(&ptls_minicrypto_secp256r1,&ptls_openssl_secp256r1);
  exit_subtest("secp256r1-from-minicrypto");
  enter_subtest("secp384r1");
  test_key_exchange(&ptls_openssl_secp384r1,&ptls_openssl_secp384r1);
  exit_subtest("secp384r1");
  enter_subtest("secp521r1");
  test_key_exchange(&ptls_openssl_secp521r1,&ptls_openssl_secp521r1);
  exit_subtest("secp521r1");
  enter_subtest("x25519-self");
  test_key_exchange(&ptls_openssl_x25519,&ptls_openssl_x25519);
  exit_subtest("x25519-self");
  enter_subtest("x25519-to-minicrypto");
  test_key_exchange(&ptls_openssl_x25519,&ptls_minicrypto_x25519);
  exit_subtest("x25519-to-minicrypto");
  enter_subtest("x25519-from-minicrypto");
  test_key_exchange(&ptls_minicrypto_x25519,&ptls_openssl_x25519);
  exit_subtest("x25519-from-minicrypto");
  return;
}

Assistant:

static void test_key_exchanges(void)
{
    subtest("secp256r1-self", test_key_exchange, &ptls_openssl_secp256r1, &ptls_openssl_secp256r1);
    subtest("secp256r1-to-minicrypto", test_key_exchange, &ptls_openssl_secp256r1, &ptls_minicrypto_secp256r1);
    subtest("secp256r1-from-minicrypto", test_key_exchange, &ptls_minicrypto_secp256r1, &ptls_openssl_secp256r1);

#if PTLS_OPENSSL_HAVE_SECP384R1
    subtest("secp384r1", test_key_exchange, &ptls_openssl_secp384r1, &ptls_openssl_secp384r1);
#endif

#if PTLS_OPENSSL_HAVE_SECP521R1
    subtest("secp521r1", test_key_exchange, &ptls_openssl_secp521r1, &ptls_openssl_secp521r1);
#endif

#if PTLS_OPENSSL_HAVE_X25519
    subtest("x25519-self", test_key_exchange, &ptls_openssl_x25519, &ptls_openssl_x25519);
    subtest("x25519-to-minicrypto", test_key_exchange, &ptls_openssl_x25519, &ptls_minicrypto_x25519);
    subtest("x25519-from-minicrypto", test_key_exchange, &ptls_minicrypto_x25519, &ptls_openssl_x25519);
#endif

#if PTLS_OPENSSL_HAVE_X25519MLKEM768
    subtest("x25519mlkem768", test_key_exchange, &ptls_openssl_x25519mlkem768, &ptls_openssl_x25519mlkem768);
#endif
}